

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

_Bool setup_pixel_format(SWindowData_X11 *window_data_x11)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDI;
  XVisualInfo *visualInfo;
  GLint glxAttribs [21];
  undefined1 local_68 [88];
  long local_10;
  
  local_10 = in_RDI;
  memcpy(local_68,&DAT_00108b30,0x54);
  lVar1 = glXChooseVisual(*(undefined8 *)(local_10 + 8),*(undefined4 *)(local_10 + 0x10),local_68);
  if (lVar1 != 0) {
    uVar2 = glXCreateContext(*(undefined8 *)(local_10 + 8),lVar1,0,1);
    *(undefined8 *)(local_10 + 0x20) = uVar2;
  }
  else {
    fprintf(_stderr,"Could not create correct visual window.\n");
    XCloseDisplay(*(undefined8 *)(local_10 + 8));
  }
  return lVar1 != 0;
}

Assistant:

bool
setup_pixel_format(SWindowData_X11 *window_data_x11) {
    GLint glxAttribs[] = {
        GLX_RGBA,
        GLX_DOUBLEBUFFER,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_RED_SIZE,       8,
        GLX_GREEN_SIZE,     8,
        GLX_BLUE_SIZE,      8,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_SAMPLE_BUFFERS, 0,
        GLX_SAMPLES,        0,
        None
    };

    XVisualInfo* visualInfo = glXChooseVisual(window_data_x11->display, window_data_x11->screen, glxAttribs);
    if (visualInfo == 0) {
        fprintf(stderr, "Could not create correct visual window.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    window_data_x11->context = glXCreateContext(window_data_x11->display, visualInfo, NULL, GL_TRUE);

    return true;
}